

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall
GdlRuleTable::DebugEngineCode
          (GdlRuleTable *this,GrcManager *pcman,uint32_t fxdRuleVersion,ostream *strmOut)

{
  ostream *poVar1;
  pointer ppGVar2;
  ulong uVar3;
  string local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>(strmOut,"\nTABLE: ",8);
  GrcSymbolTableEntry::FullName_abi_cxx11_(&local_48,this->m_psymName);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (strmOut,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  ppGVar2 = (this->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppGVar2) {
    uVar3 = 0;
    do {
      GdlPass::DebugEngineCode(ppGVar2[uVar3],pcman,fxdRuleVersion,strmOut);
      uVar3 = uVar3 + 1;
      ppGVar2 = (this->m_vppass).super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->m_vppass).
                                   super__Vector_base<GdlPass_*,_std::allocator<GdlPass_*>_>._M_impl
                                   .super__Vector_impl_data._M_finish - (long)ppGVar2 >> 3));
  }
  return;
}

Assistant:

void GdlRuleTable::DebugEngineCode(GrcManager * pcman, uint32_t fxdRuleVersion, std::ostream & strmOut)
{
	strmOut << "\nTABLE: " << m_psymName->FullName() << "\n";
	for (size_t ippass = 0; ippass < m_vppass.size(); ippass++)
	{
		m_vppass[ippass]->DebugEngineCode(pcman, fxdRuleVersion, strmOut);
	}
}